

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall application::Chat::Chat(Chat *this)

{
  anon_class_1_0_00000001 local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  Chat *local_10;
  Chat *this_local;
  
  local_10 = this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring((wstring *)this,L"Unknown user",&local_11);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_11);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring((wstring *)&this->separator_,L": ",local_25);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)local_25);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring
            ((wstring *)&this->prompt_,L"---------------\nEnter you message: ",&local_26);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_26);
  std::__cxx11::wstring::wstring((wstring *)&this->input_);
  std::function<void_(application::Message)>::function(&this->sendMessageCallback_);
  std::function<void()>::function<application::Chat::Chat()::__0,void>
            ((function<void()> *)&this->beforeExiting_,&local_27);
  std::mutex::mutex(&this->mut);
  calcPrompt(this);
  return;
}

Assistant:

Chat::Chat()
	: username_(L"Unknown user"), separator_(L": "), prompt_(L"---------------\nEnter you message: "), beforeExiting_([]() {})
{
	calcPrompt();
}